

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

double __thiscall pugi::xpath_query::evaluate_number(xpath_query *this,xpath_node *n)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  xpath_context c;
  xpath_stack_data sd;
  xpath_context local_20a8;
  xpath_memory_block local_2080;
  xpath_memory_block local_1070;
  xpath_allocator local_60;
  xpath_allocator local_48;
  xpath_stack local_30;
  bool local_20 [8];
  
  if ((undefined8 *)this->_impl != (undefined8 *)0x0) {
    local_20a8.n._node._root = (n->_node)._root;
    local_20a8.n._attribute._attr = (n->_attribute)._attr;
    local_20a8.position = 1;
    local_20a8.size = 1;
    local_60._error = local_20;
    local_60._root = &local_2080;
    local_60._root_size = 0;
    local_48._root = &local_1070;
    local_48._root_size = 0;
    local_20[0] = false;
    local_1070.next = (xpath_memory_block *)0x0;
    local_2080.next = (xpath_memory_block *)0x0;
    local_1070.capacity = 0x1000;
    local_2080.capacity = 0x1000;
    local_48._error = local_60._error;
    local_30.result = &local_60;
    local_30.temp = &local_48;
    dVar1 = impl::anon_unknown_0::xpath_ast_node::eval_number(*this->_impl,&local_20a8,&local_30);
    uVar2 = SUB84(dVar1,0);
    uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
    if (local_20[0] != false) {
      uVar2 = 0;
      uVar3 = 0x7ff80000;
    }
    impl::anon_unknown_0::xpath_allocator::release(&local_60);
    impl::anon_unknown_0::xpath_allocator::release(&local_48);
    return (double)CONCAT44(uVar3,uVar2);
  }
  return NAN;
}

Assistant:

PUGI_IMPL_FN double xpath_query::evaluate_number(const xpath_node& n) const
	{
		if (!_impl) return impl::gen_nan();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		double r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_number(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return impl::gen_nan();
		#else
			throw std::bad_alloc();
		#endif
		}

		return r;
	}